

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

OPJ_BOOL opj_t1_decode_cblks(opj_t1_t *t1,opj_tcd_tilecomp_t *tilec,opj_tccp_t *tccp)

{
  uint uVar1;
  uint uVar2;
  OPJ_INT32 OVar3;
  int iVar4;
  opj_tcd_resolution_t *poVar5;
  opj_tcd_precinct_t *poVar6;
  OPJ_INT32 *pOVar7;
  byte bVar8;
  uint uVar9;
  OPJ_BOOL OVar10;
  opj_tcd_band_t *poVar11;
  opj_tcd_cblk_dec_t *cblk_00;
  int local_c8;
  float *pfStack_c0;
  OPJ_FLOAT32 tmp_1;
  OPJ_FLOAT32 *tiledp2;
  OPJ_FLOAT32 *tiledp_1;
  OPJ_INT32 tmp;
  OPJ_INT32 *tiledp;
  OPJ_INT32 mag;
  OPJ_INT32 val;
  OPJ_INT32 thresh;
  opj_tcd_resolution_t *pres_1;
  opj_tcd_resolution_t *pres;
  OPJ_UINT32 j;
  OPJ_UINT32 i;
  OPJ_INT32 y;
  OPJ_INT32 x;
  OPJ_UINT32 cblk_h;
  OPJ_UINT32 cblk_w;
  OPJ_INT32 *datap;
  opj_tcd_cblk_dec_t *cblk;
  opj_tcd_precinct_t *precinct;
  opj_tcd_band_t *band;
  opj_tcd_resolution_t *res;
  uint local_38;
  OPJ_UINT32 tile_w;
  OPJ_UINT32 cblkno;
  OPJ_UINT32 precno;
  OPJ_UINT32 bandno;
  OPJ_UINT32 resno;
  opj_tccp_t *tccp_local;
  opj_tcd_tilecomp_t *tilec_local;
  opj_t1_t *t1_local;
  
  uVar9 = tilec->x1 - tilec->x0;
  precno = 0;
  do {
    if (tilec->minimum_num_resolutions <= precno) {
      return 1;
    }
    poVar5 = tilec->resolutions;
    for (cblkno = 0; cblkno < poVar5[precno].numbands; cblkno = cblkno + 1) {
      poVar11 = poVar5[precno].bands + cblkno;
      for (tile_w = 0; tile_w < poVar5[precno].pw * poVar5[precno].ph; tile_w = tile_w + 1) {
        poVar6 = poVar11->precincts;
        for (local_38 = 0; local_38 < poVar6[tile_w].cw * poVar6[tile_w].ch; local_38 = local_38 + 1
            ) {
          cblk_00 = (opj_tcd_cblk_dec_t *)(poVar6[tile_w].cblks.enc + local_38);
          OVar10 = opj_t1_decode_cblk(t1,cblk_00,poVar11->bandno,tccp->roishift,tccp->cblksty);
          if (OVar10 == 0) {
            return 0;
          }
          i = cblk_00->x0 - poVar11->x0;
          j = cblk_00->y0 - poVar11->y0;
          if ((poVar11->bandno & 1) != 0) {
            i = (tilec->resolutions[precno - 1].x1 - tilec->resolutions[precno - 1].x0) + i;
          }
          if ((poVar11->bandno & 2) != 0) {
            j = (tilec->resolutions[precno - 1].y1 - tilec->resolutions[precno - 1].y0) + j;
          }
          _cblk_h = t1->data;
          uVar1 = t1->w;
          uVar2 = t1->h;
          if (tccp->roishift != 0) {
            OVar3 = tccp->roishift;
            for (pres._0_4_ = 0; (uint)pres < uVar2; pres._0_4_ = (uint)pres + 1) {
              for (pres._4_4_ = 0; pres._4_4_ < uVar1; pres._4_4_ = pres._4_4_ + 1) {
                iVar4 = _cblk_h[(uint)pres * uVar1 + pres._4_4_];
                local_c8 = iVar4;
                if (iVar4 < 1) {
                  local_c8 = -iVar4;
                }
                if (1 << ((byte)OVar3 & 0x1f) <= local_c8) {
                  bVar8 = (byte)tccp->roishift & 0x1f;
                  local_c8 = local_c8 >> bVar8;
                  if (iVar4 < 0) {
                    local_c8 = (0 >> bVar8) - local_c8;
                  }
                  _cblk_h[(uint)pres * uVar1 + pres._4_4_] = local_c8;
                }
              }
            }
          }
          if (tccp->qmfbid == 1) {
            pOVar7 = tilec->data;
            for (pres._0_4_ = 0; (uint)pres < uVar2; pres._0_4_ = (uint)pres + 1) {
              for (pres._4_4_ = 0; pres._4_4_ < uVar1; pres._4_4_ = pres._4_4_ + 1) {
                pOVar7[(ulong)(j * uVar9 + i) + (ulong)((uint)pres * uVar9 + pres._4_4_)] =
                     _cblk_h[(uint)pres * uVar1 + pres._4_4_] / 2;
              }
            }
          }
          else {
            tiledp2 = (OPJ_FLOAT32 *)(tilec->data + (j * uVar9 + i));
            for (pres._0_4_ = 0; (uint)pres < uVar2; pres._0_4_ = (uint)pres + 1) {
              pfStack_c0 = (float *)tiledp2;
              for (pres._4_4_ = 0; pres._4_4_ < uVar1; pres._4_4_ = pres._4_4_ + 1) {
                *pfStack_c0 = (float)*_cblk_h * (float)poVar11->stepsize;
                _cblk_h = _cblk_h + 1;
                pfStack_c0 = pfStack_c0 + 1;
              }
              tiledp2 = tiledp2 + uVar9;
            }
          }
        }
      }
    }
    precno = precno + 1;
  } while( true );
}

Assistant:

OPJ_BOOL opj_t1_decode_cblks(   opj_t1_t* t1,
                            opj_tcd_tilecomp_t* tilec,
                            opj_tccp_t* tccp
                            )
{
	OPJ_UINT32 resno, bandno, precno, cblkno;
	OPJ_UINT32 tile_w = (OPJ_UINT32)(tilec->x1 - tilec->x0);

	for (resno = 0; resno < tilec->minimum_num_resolutions; ++resno) {
		opj_tcd_resolution_t* res = &tilec->resolutions[resno];

		for (bandno = 0; bandno < res->numbands; ++bandno) {
			opj_tcd_band_t* OPJ_RESTRICT band = &res->bands[bandno];

			for (precno = 0; precno < res->pw * res->ph; ++precno) {
				opj_tcd_precinct_t* precinct = &band->precincts[precno];

				for (cblkno = 0; cblkno < precinct->cw * precinct->ch; ++cblkno) {
					opj_tcd_cblk_dec_t* cblk = &precinct->cblks.dec[cblkno];
					OPJ_INT32* OPJ_RESTRICT datap;
					OPJ_UINT32 cblk_w, cblk_h;
					OPJ_INT32 x, y;
					OPJ_UINT32 i, j;

                    if (OPJ_FALSE == opj_t1_decode_cblk(
                                            t1,
                                            cblk,
                                            band->bandno,
                                            (OPJ_UINT32)tccp->roishift,
                                            tccp->cblksty)) {
                            return OPJ_FALSE;
                    }

					x = cblk->x0 - band->x0;
					y = cblk->y0 - band->y0;
					if (band->bandno & 1) {
						opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
						x += pres->x1 - pres->x0;
					}
					if (band->bandno & 2) {
						opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
						y += pres->y1 - pres->y0;
					}

					datap=t1->data;
					cblk_w = t1->w;
					cblk_h = t1->h;

					if (tccp->roishift) {
						OPJ_INT32 thresh = 1 << tccp->roishift;
						for (j = 0; j < cblk_h; ++j) {
							for (i = 0; i < cblk_w; ++i) {
								OPJ_INT32 val = datap[(j * cblk_w) + i];
								OPJ_INT32 mag = abs(val);
								if (mag >= thresh) {
									mag >>= tccp->roishift;
									datap[(j * cblk_w) + i] = val < 0 ? -mag : mag;
								}
							}
						}
					}
					if (tccp->qmfbid == 1) {
                        OPJ_INT32* OPJ_RESTRICT tiledp = &tilec->data[(OPJ_UINT32)y * tile_w + (OPJ_UINT32)x];
						for (j = 0; j < cblk_h; ++j) {
							for (i = 0; i < cblk_w; ++i) {
								OPJ_INT32 tmp = datap[(j * cblk_w) + i];
								((OPJ_INT32*)tiledp)[(j * tile_w) + i] = tmp/2;
							}
						}
					} else {		/* if (tccp->qmfbid == 0) */
                        OPJ_FLOAT32* OPJ_RESTRICT tiledp = (OPJ_FLOAT32*) &tilec->data[(OPJ_UINT32)y * tile_w + (OPJ_UINT32)x];
						for (j = 0; j < cblk_h; ++j) {
                            OPJ_FLOAT32* OPJ_RESTRICT tiledp2 = tiledp;
							for (i = 0; i < cblk_w; ++i) {
                                OPJ_FLOAT32 tmp = (OPJ_FLOAT32)*datap * band->stepsize;
                                *tiledp2 = tmp;
                                datap++;
                                tiledp2++;
							}
                            tiledp += tile_w;
						}
					}
				} /* cblkno */
			} /* precno */
		} /* bandno */
	} /* resno */
        return OPJ_TRUE;
}